

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O3

MPP_RET get_packet(Kmpp *ctx,MppPacket *packet)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  MPP_RET MVar5;
  long *param;
  void *__dest;
  MppMeta meta;
  uint uVar6;
  char *fmt;
  MppPacket pvVar7;
  ulong size;
  MppPacket pkt;
  timeval timeout;
  fd_set read_fds;
  MppPacket local_d8;
  MppPacket local_d0;
  timeval local_c8;
  fd_set local_b8;
  
  if (ctx == (Kmpp *)0x0) {
    MVar5 = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    MVar5 = MPP_ERR_INIT;
  }
  else {
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    iVar1 = ctx->mClientFd;
    iVar3 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    local_b8.fds_bits[iVar3 >> 6] =
         local_b8.fds_bits[iVar3 >> 6] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
    local_c8.tv_sec = (ctx->mTimeout).tv_sec;
    local_c8.tv_usec = (ctx->mTimeout).tv_usec;
    uVar4 = select(iVar1 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
    if ((int)uVar4 < 1) {
      fmt = "get venc stream error %d\n";
    }
    else {
      uVar4 = ctx->mClientFd;
      uVar6 = uVar4 + 0x3f;
      if (-1 < (int)uVar4) {
        uVar6 = uVar4;
      }
      if (((ulong)local_b8.fds_bits[(int)uVar6 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        return MPP_OK;
      }
      param = (long *)mpp_mem_pool_get_f("get_packet",ctx->mVencPacketPool);
      MVar5 = mpp_vcodec_ioctl(ctx->mClientFd,0x601,0,0xb8,param);
      if (MVar5 == MPP_OK) {
        size = (ulong)*(uint *)(param + 2);
        if (size == 0) {
          return MPP_OK;
        }
        local_d8 = (MppPacket)0x0;
        lVar2 = *param;
        if (lVar2 == 0) {
          local_d8 = (MppPacket)0x0;
        }
        else {
          pvVar7 = ctx->mPacket;
          if (pvVar7 == (MppPacket)0x0) {
            mpp_packet_init(&local_d8,(void *)(lVar2 + (ulong)*(uint *)(param + 6)),size);
            mpp_packet_set_release(local_d8,kmpp_release_venc_packet,ctx,param);
            pvVar7 = local_d8;
          }
          else {
            ctx->mPacket = (MppPacket)0x0;
            local_d8 = pvVar7;
            local_d0 = pvVar7;
            __dest = mpp_packet_get_pos(pvVar7);
            memcpy(__dest,(void *)(lVar2 + (ulong)*(uint *)(param + 6)),size);
            mpp_vcodec_ioctl(ctx->mClientFd,0x602,0,0xb8,param);
            mpp_packet_set_length(local_d0,size);
            mpp_mem_pool_put_f("get_packet",ctx->mVencPacketPool,param);
            pvVar7 = local_d0;
          }
          mpp_packet_set_dts(pvVar7,param[4]);
          mpp_packet_set_pts(local_d8,param[3]);
          mpp_packet_set_flag(local_d8,*(RK_U32 *)(param + 5));
          if ((*(byte *)(param + 5) & 0x10) != 0) {
            meta = mpp_packet_get_meta(local_d8);
            mpp_meta_set_s32(meta,KEY_OUTPUT_INTRA,1);
          }
        }
        *packet = local_d8;
        return MPP_OK;
      }
      uVar4 = ctx->mChanId;
      fmt = "chan %d VCODEC_CHAN_OUT_STRM_BUF_RDY failed\n";
    }
    _mpp_log_l(2,"kmpp",fmt,(char *)0x0,(ulong)uVar4);
    MVar5 = MPP_NOK;
  }
  return MVar5;
}

Assistant:

static MPP_RET get_packet(Kmpp *ctx, MppPacket *packet)
{
    RK_S32 ret;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    struct timeval timeout;
    fd_set read_fds;

    FD_ZERO(&read_fds);
    FD_SET(ctx->mClientFd, &read_fds);

    memcpy(&timeout, &ctx->mTimeout, sizeof(timeout));
    ret = select(ctx->mClientFd + 1, &read_fds, NULL, NULL, &timeout);
    if (ret <= 0) {
        mpp_err("get venc stream error %d\n", ret);
        return MPP_NOK;
    }

    if (FD_ISSET(ctx->mClientFd, &read_fds)) {
        VencPacket *venc_packet = mpp_mem_pool_get(ctx->mVencPacketPool);

        ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_OUT_STRM_BUF_RDY, 0, sizeof(VencPacket), venc_packet);
        if (ret) {
            mpp_err("chan %d VCODEC_CHAN_OUT_STRM_BUF_RDY failed\n", ctx->mChanId);
            return MPP_NOK;
        }

        if (venc_packet->len) {
            MppPacket pkt = NULL;
            void *ptr = NULL;
            RK_U32 len = venc_packet->len;

            ptr = (void *)(intptr_t)(venc_packet->u64priv_data);

            if (ptr) {
                if (ctx->mPacket) {
                    void *dst;

                    pkt = ctx->mPacket;
                    ctx->mPacket = NULL;
                    dst = mpp_packet_get_pos(pkt);
                    memcpy(dst, ptr + venc_packet->offset, len);
                    mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_OUT_STRM_END, 0, sizeof(VencPacket), venc_packet);
                    mpp_packet_set_length(pkt, len);
                    mpp_mem_pool_put(ctx->mVencPacketPool, venc_packet);
                } else {
                    mpp_packet_init(&pkt, ptr + venc_packet->offset, len);
                    mpp_packet_set_release(pkt, kmpp_release_venc_packet, ctx, venc_packet);
                }
                mpp_packet_set_dts(pkt, venc_packet->u64dts);
                mpp_packet_set_pts(pkt, venc_packet->u64pts);
                mpp_packet_set_flag(pkt, venc_packet->flag);
                if (venc_packet->flag & MPP_PACKET_FLAG_INTRA) {
                    MppMeta meta = mpp_packet_get_meta(pkt);

                    mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA, 1);
                }
            }
            *packet = pkt;
        }
    }

    return MPP_OK;
}